

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ssh_key * ecdsa_new_pub(ssh_keyalg *alg,ptrlen data)

{
  _Bool _Var1;
  ec_curve *curve_00;
  undefined8 *puVar2;
  WeierstrassPoint *pWVar3;
  ptrlen pl;
  ecdsa_key *ek;
  undefined1 local_68 [8];
  BinarySource src [1];
  ec_curve *curve;
  ecsign_extra *extra;
  ssh_keyalg *alg_local;
  ptrlen data_local;
  
  curve_00 = (ec_curve *)(**alg->extra)();
  if (curve_00->type == EC_WEIERSTRASS) {
    BinarySource_INIT__((BinarySource *)local_68,data);
    BinarySource_get_string((BinarySource *)src[0]._24_8_);
    pl = BinarySource_get_string((BinarySource *)src[0]._24_8_);
    _Var1 = ptrlen_eq_string(pl,curve_00->name);
    if (_Var1) {
      puVar2 = (undefined8 *)safemalloc(1,0x20,0);
      puVar2[3] = alg;
      *puVar2 = curve_00;
      puVar2[2] = 0;
      pWVar3 = BinarySource_get_wpoint((BinarySource *)src[0]._24_8_,curve_00);
      puVar2[1] = pWVar3;
      if (puVar2[1] == 0) {
        ecdsa_freekey((ssh_key *)(puVar2 + 3));
        data_local.len = 0;
      }
      else {
        data_local.len = (size_t)(puVar2 + 3);
      }
    }
    else {
      data_local.len = 0;
    }
    return (ssh_key *)data_local.len;
  }
  __assert_fail("curve->type == EC_WEIERSTRASS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x278,"ssh_key *ecdsa_new_pub(const ssh_keyalg *, ptrlen)");
}

Assistant:

static ssh_key *ecdsa_new_pub(const ssh_keyalg *alg, ptrlen data)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_WEIERSTRASS);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, data);
    get_string(src);

    /* Curve name is duplicated for Weierstrass form */
    if (!ptrlen_eq_string(get_string(src), curve->name))
        return NULL;

    struct ecdsa_key *ek = snew(struct ecdsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_wpoint(src, curve);
    if (!ek->publicKey) {
        ecdsa_freekey(&ek->sshk);
        return NULL;
    }

    return &ek->sshk;
}